

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_AngleTo(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  undefined8 *puVar5;
  AActor *other;
  bool bVar6;
  _func_int **local_38;
  PClass *pPVar2;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00434b1c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00434b03:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00434b1c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1a,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_004349d3;
    pPVar2 = (other->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (other->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar6 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar6) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar6 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00434b1c;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_00434b03;
LAB_004349d3:
    other = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00434b3b;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00434b0c:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00434b3b;
  }
  puVar5 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar5 == (undefined8 *)0x0) goto LAB_00434a06;
LAB_00434a1b:
    pPVar2 = AActor::RegistrationInfo.MyClass;
    pPVar3 = (PClass *)puVar5[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*puVar5)(puVar5);
      puVar5[1] = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar2 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar2) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "targ == NULL || targ->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00434b3b:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e1b,
                    "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (puVar5 != (undefined8 *)0x0) goto LAB_00434b0c;
LAB_00434a06:
    NullParam("\"targ\"");
    puVar5 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar5 != (undefined8 *)0x0) goto LAB_00434a1b;
    puVar5 = (undefined8 *)0x0;
  }
  if (numparam < 3) {
    if (defaultparam->Array[2].field_0.field_3.Type == '\0') goto LAB_00434ab1;
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
LAB_00434ab1:
      AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(puVar5,0));
      if (numret < 1) {
        iVar1 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1d,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        if (ret->RegType != '\x01') {
          __assert_fail("RegType == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x144,"void VMReturn::SetFloat(double)");
        }
        *(_func_int ***)ret->Location = local_38;
        iVar1 = 1;
      }
      return iVar1;
    }
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e1c,"int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AngleTo)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(targ, AActor);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_FLOAT(self->AngleTo(targ, absolute).Degrees);
}